

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O2

int __thiscall
soplex::
ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
::number(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
         *this,DLPSV *item)

{
  SPxException *this_00;
  ulong uVar1;
  allocator local_39;
  string local_38;
  
  uVar1 = (long)item - (long)this->theitem;
  if ((-1 < (long)uVar1) && ((long)(uVar1 / 0x28) < (long)this->thesize)) {
    return *(int *)((long)this->theitem + uVar1 + 0x20);
  }
  this_00 = (SPxException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_38,"Invalid index",&local_39);
  SPxException::SPxException(this_00,&local_38);
  __cxa_throw(this_00,&SPxException::typeinfo,SPxException::~SPxException);
}

Assistant:

int number(const T* item) const
   {
      ptrdiff_t idx = reinterpret_cast<const struct Item*>(item) - theitem;

      if(idx < 0 || idx >= size())
         throw SPxException("Invalid index");

      return theitem[idx].info;
   }